

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rune * nk_textedit_createundo(nk_text_undo_state *state,int pos,int insert_len,int delete_len)

{
  nk_text_undo_record *pnVar1;
  short in_CX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  nk_text_undo_record *r;
  nk_text_undo_state *in_stack_ffffffffffffffd8;
  nk_rune *local_8;
  
  pnVar1 = nk_textedit_create_undo_record(in_stack_ffffffffffffffd8,0);
  if (pnVar1 == (nk_text_undo_record *)0x0) {
    local_8 = (nk_rune *)0x0;
  }
  else {
    pnVar1->where = in_ESI;
    pnVar1->insert_length = (short)in_EDX;
    pnVar1->delete_length = in_CX;
    if (in_EDX == 0) {
      pnVar1->char_storage = -1;
      local_8 = (nk_rune *)0x0;
    }
    else {
      pnVar1->char_storage = *(short *)(in_RDI + 0x1444);
      *(short *)(in_RDI + 0x1444) = *(short *)(in_RDI + 0x1444) + (short)in_EDX;
      local_8 = (nk_rune *)(in_RDI + 0x4a4 + (long)pnVar1->char_storage * 4);
    }
  }
  return local_8;
}

Assistant:

NK_INTERN nk_rune*
nk_textedit_createundo(struct nk_text_undo_state *state, int pos,
int insert_len, int delete_len)
{
struct nk_text_undo_record *r = nk_textedit_create_undo_record(state, insert_len);
if (r == 0)
return 0;

r->where = pos;
r->insert_length = (short) insert_len;
r->delete_length = (short) delete_len;

if (insert_len == 0) {
r->char_storage = -1;
return 0;
} else {
r->char_storage = state->undo_char_point;
state->undo_char_point = (short)(state->undo_char_point +  insert_len);
return &state->undo_char[r->char_storage];
}
}